

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

void __thiscall ON_TextDot::Dump(ON_TextDot *this,ON_TextLog *log)

{
  wchar_t *pwVar1;
  
  ON_TextLog::Print(log,L"Center: ");
  ON_TextLog::Print(log,&this->m_center_point);
  ON_TextLog::Print(log,L"\n");
  pwVar1 = ON_wString::operator_cast_to_wchar_t_(&this->m_primary_text);
  ON_TextLog::Print(log,L"Primary text: \"%ls\"\n",pwVar1);
  pwVar1 = ON_wString::operator_cast_to_wchar_t_(&this->m_secondary_text);
  ON_TextLog::Print(log,L"Secondary text: \"%ls\"\n",pwVar1);
  ON_TextLog::Print(log,L"Height in points: %d\n",(ulong)(uint)this->m_height_in_points);
  pwVar1 = ON_wString::operator_cast_to_wchar_t_(&this->m_font_face);
  ON_TextLog::Print(log,L"Font face: \"%ls\"\n",pwVar1);
  return;
}

Assistant:

void ON_TextDot::Dump( ON_TextLog& log) const
{
  log.Print(L"Center: ");
  log.Print( m_center_point);
  log.Print(L"\n");
  log.Print(L"Primary text: \"%ls\"\n", static_cast<const wchar_t*>(m_primary_text));
  log.Print(L"Secondary text: \"%ls\"\n", static_cast<const wchar_t*>(m_secondary_text));
  log.Print(L"Height in points: %d\n", m_height_in_points);
  log.Print(L"Font face: \"%ls\"\n", static_cast<const wchar_t*>(m_font_face));

}